

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# login_message.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::LoginMessage::LoginMessage
          (LoginMessage *this,string *username,string *password,string *alias,string *application,
          string *application_version,string *api,string *api_version,string *product_serial_number)

{
  string *application_version_local;
  string *application_local;
  string *alias_local;
  string *password_local;
  string *username_local;
  LoginMessage *this_local;
  
  PixieMessage::PixieMessage(&this->super_PixieMessage);
  (this->super_PixieMessage)._vptr_PixieMessage = (_func_int **)&PTR_Encode_003a3a00;
  std::__cxx11::string::string((string *)&this->username_);
  std::__cxx11::string::string((string *)&this->password_);
  std::__cxx11::string::string((string *)&this->alias_);
  std::__cxx11::string::string((string *)&this->application_);
  std::__cxx11::string::string((string *)&this->application_version_);
  std::__cxx11::string::string((string *)&this->api_);
  std::__cxx11::string::string((string *)&this->api_version_);
  std::__cxx11::string::string((string *)&this->product_);
  std::__cxx11::string::string((string *)&this->product_serial_number_);
  std::__cxx11::string::operator=((string *)&this->username_,(string *)username);
  std::__cxx11::string::operator=((string *)&this->password_,(string *)password);
  std::__cxx11::string::operator=((string *)&this->alias_,(string *)alias);
  std::__cxx11::string::operator=((string *)&this->application_,(string *)application);
  std::__cxx11::string::operator=
            ((string *)&this->application_version_,(string *)application_version);
  std::__cxx11::string::operator=((string *)&this->api_,(string *)api);
  std::__cxx11::string::operator=((string *)&this->api_version_,(string *)api_version);
  std::__cxx11::string::operator=((string *)&this->product_,"BidFXCpp");
  std::__cxx11::string::operator=
            ((string *)&this->product_serial_number_,(string *)product_serial_number);
  return;
}

Assistant:

LoginMessage::LoginMessage(std::string username, std::string password, std::string alias, std::string application,
                           std::string application_version, std::string api, std::string api_version, std::string product_serial_number)
{
    username_ = username;
    password_ = password;
    alias_ = alias;
    application_ = application;
    application_version_ = application_version;
    api_ = api;
    api_version_ = api_version;
    product_ = "BidFXCpp";
    product_serial_number_ = product_serial_number;
}